

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void __thiscall duckdb::Executor::VerifyPipeline(Executor *this,Pipeline *pipeline)

{
  PhysicalOperator *pPVar1;
  Pipeline *this_00;
  reference pvVar2;
  shared_ptr<duckdb::Pipeline,_true> *this_01;
  size_type __n;
  size_type __n_00;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> operators;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> other_operators;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> local_68;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> local_50;
  shared_ptr<duckdb::Pipeline,_true> *local_38;
  
  Pipeline::GetOperators(&local_68,pipeline);
  this_01 = (this->pipelines).
            super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
            .
            super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->pipelines).
             super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != local_38) {
    do {
      this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->(this_01);
      Pipeline::GetOperators(&local_50,this_00);
      if (local_68.
          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_68.
          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          if (local_50.
              super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_50.
              super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            __n_00 = 0;
            do {
              pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                                 (&local_68,__n);
              pPVar1 = pvVar2->_M_data;
              pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                                 (&local_50,__n_00);
              (*pPVar1->_vptr_PhysicalOperator[6])(pPVar1,pvVar2->_M_data);
              __n_00 = __n_00 + 1;
            } while (__n_00 < (ulong)((long)local_50.
                                            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                            .
                                            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_50.
                                            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                            .
                                            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          __n = __n + 1;
        } while (__n < (ulong)((long)local_68.
                                     super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                     .
                                     super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_68.
                                     super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                     .
                                     super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (local_50.
          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.
                        super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                        .
                        super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      this_01 = this_01 + 1;
    } while (this_01 != local_38);
  }
  if (local_68.
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Executor::VerifyPipeline(Pipeline &pipeline) {
	D_ASSERT(!pipeline.ToString().empty());
	auto operators = pipeline.GetOperators();
	for (auto &other_pipeline : pipelines) {
		auto other_operators = other_pipeline->GetOperators();
		for (idx_t op_idx = 0; op_idx < operators.size(); op_idx++) {
			for (idx_t other_idx = 0; other_idx < other_operators.size(); other_idx++) {
				auto &left = operators[op_idx].get();
				auto &right = other_operators[other_idx].get();
				if (left.Equals(right)) {
					D_ASSERT(right.Equals(left));
				} else {
					D_ASSERT(!right.Equals(left));
				}
			}
		}
	}
}